

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_encrypt.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  size_t sVar2;
  FILE *pFVar3;
  char *pcVar4;
  undefined1 local_d20 [8];
  mbedtls_mpi E;
  mbedtls_mpi N;
  char *pers;
  uchar buf [512];
  uchar input [1024];
  undefined1 local_6e0 [8];
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_rsa_context rsa;
  size_t i;
  int exit_code;
  int ret;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  i._0_4_ = 1;
  if (argc != 2) {
    printf("usage: rsa_encrypt <string of max 100 characters>\n");
    exit(1);
  }
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_mpi_init((mbedtls_mpi *)&E.p);
  mbedtls_mpi_init((mbedtls_mpi *)local_d20);
  mbedtls_rsa_init((mbedtls_rsa_context *)&entropy.source[0x13].strong,0,0);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)local_6e0);
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  sVar2 = strlen("rsa_encrypt");
  uVar1 = mbedtls_ctr_drbg_seed
                    ((mbedtls_ctr_drbg_context *)local_6e0,mbedtls_entropy_func,&ctr_drbg.p_entropy,
                     (uchar *)"rsa_encrypt",sVar2);
  if (uVar1 == 0) {
    printf("\n  . Reading public key from rsa_pub.txt");
    fflush(_stdout);
    pFVar3 = fopen("rsa_pub.txt","rb");
    if (pFVar3 == (FILE *)0x0) {
      printf(" failed\n  ! Could not open rsa_pub.txt\n  ! Please run rsa_genkey first\n\n");
    }
    else {
      i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&E.p,0x10,(FILE *)pFVar3);
      if (i._4_4_ == 0) {
        i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)local_d20,0x10,(FILE *)pFVar3);
        if (i._4_4_ == 0) {
          fclose(pFVar3);
          uVar1 = mbedtls_rsa_import((mbedtls_rsa_context *)&entropy.source[0x13].strong,
                                     (mbedtls_mpi *)&E.p,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                     (mbedtls_mpi *)0x0,(mbedtls_mpi *)local_d20);
          if (uVar1 == 0) {
            sVar2 = strlen(argv[1]);
            if (sVar2 < 0x65) {
              pcVar4 = argv[1];
              sVar2 = strlen(argv[1]);
              memcpy(buf + 0x1f8,pcVar4,sVar2);
              printf("\n  . Generating the RSA encrypted value");
              fflush(_stdout);
              sVar2 = strlen(argv[1]);
              uVar1 = mbedtls_rsa_pkcs1_encrypt
                                ((mbedtls_rsa_context *)&entropy.source[0x13].strong,
                                 mbedtls_ctr_drbg_random,local_6e0,0,sVar2,buf + 0x1f8,
                                 (uchar *)&pers);
              if (uVar1 == 0) {
                pFVar3 = fopen("result-enc.txt","wb+");
                if (pFVar3 == (FILE *)0x0) {
                  printf(" failed\n  ! Could not create %s\n\n","result-enc.txt");
                }
                else {
                  rsa.padding = 0;
                  rsa.hash_id = 0;
                  for (; (ulong)rsa._328_8_ < (ulong)rsa._0_8_; rsa._328_8_ = rsa._328_8_ + 1) {
                    pcVar4 = " ";
                    if ((rsa._328_8_ + 1 & 0xf) == 0) {
                      pcVar4 = "\r\n";
                    }
                    fprintf(pFVar3,"%02X%s",(ulong)buf[rsa._328_8_ + -8],pcVar4);
                  }
                  fclose(pFVar3);
                  printf("\n  . Done (created \"%s\")\n\n","result-enc.txt");
                  i._0_4_ = 0;
                }
              }
              else {
                printf(" failed\n  ! mbedtls_rsa_pkcs1_encrypt returned %d\n\n",(ulong)uVar1);
              }
            }
            else {
              printf(" Input data larger than 100 characters.\n\n");
            }
          }
          else {
            printf(" failed\n  ! mbedtls_rsa_import returned %d\n\n",(ulong)uVar1);
          }
          goto LAB_0010768c;
        }
      }
      printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)i._4_4_);
      fclose(pFVar3);
    }
  }
  else {
    printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)uVar1);
  }
LAB_0010768c:
  mbedtls_mpi_free((mbedtls_mpi *)&E.p);
  mbedtls_mpi_free((mbedtls_mpi *)local_d20);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)local_6e0);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  mbedtls_rsa_free((mbedtls_rsa_context *)&entropy.source[0x13].strong);
  return (int)i;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    size_t i;
    mbedtls_rsa_context rsa;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char input[1024];
    unsigned char buf[512];
    const char *pers = "rsa_encrypt";
    mbedtls_mpi N, E;

    if( argc != 2 )
    {
        mbedtls_printf( "usage: rsa_encrypt <string of max 100 characters>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        mbedtls_exit( exit_code );
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &E );
    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_entropy_init( &entropy );

    ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func,
                                 &entropy, (const unsigned char *) pers,
                                 strlen( pers ) );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",
                        ret );
        goto exit;
    }

    mbedtls_printf( "\n  . Reading public key from rsa_pub.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_pub.txt", "rb" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! Could not open rsa_pub.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    if( ( ret = mbedtls_mpi_read_file( &N, 16, f ) ) != 0 ||
        ( ret = mbedtls_mpi_read_file( &E, 16, f ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n",
                        ret );
        fclose( f );
        goto exit;
    }
    fclose( f );

    if( ( ret = mbedtls_rsa_import( &rsa, &N, NULL, NULL, NULL, &E ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_import returned %d\n\n",
                        ret );
        goto exit;
    }

    if( strlen( argv[1] ) > 100 )
    {
        mbedtls_printf( " Input data larger than 100 characters.\n\n" );
        goto exit;
    }

    memcpy( input, argv[1], strlen( argv[1] ) );

    /*
     * Calculate the RSA encryption of the hash.
     */
    mbedtls_printf( "\n  . Generating the RSA encrypted value" );
    fflush( stdout );

    ret = mbedtls_rsa_pkcs1_encrypt( &rsa, mbedtls_ctr_drbg_random,
                                     &ctr_drbg, MBEDTLS_RSA_PUBLIC,
                                     strlen( argv[1] ), input, buf );
    if( ret != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_encrypt returned %d\n\n",
                        ret );
        goto exit;
    }

    /*
     * Write the signature into result-enc.txt
     */
    if( ( f = fopen( "result-enc.txt", "wb+" ) ) == NULL )
    {
        mbedtls_printf( " failed\n  ! Could not create %s\n\n", "result-enc.txt" );
        goto exit;
    }

    for( i = 0; i < rsa.len; i++ )
        mbedtls_fprintf( f, "%02X%s", buf[i],
                 ( i + 1 ) % 16 == 0 ? "\r\n" : " " );

    fclose( f );

    mbedtls_printf( "\n  . Done (created \"%s\")\n\n", "result-enc.txt" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:
    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &E );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );
    mbedtls_rsa_free( &rsa );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}